

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

bool __thiscall CppJieba::Trie::loadDict(Trie *this,char *filePath)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  if (this->_initFlag == false) {
    std::__cxx11::string::string((string *)&local_38,"not initted.",&local_39);
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x82,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,filePath,&local_39);
    bVar1 = Limonp::checkFileExist(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      bVar1 = _trieInsert(this,filePath);
      if (bVar1) {
        bVar1 = _countWeight(this);
        if (bVar1) {
          return true;
        }
        std::__cxx11::string::string((string *)&local_38,"_countWeight failed.",&local_39);
        Limonp::Logger::LoggingF(3,"Trie.hpp",0x95,&local_38);
      }
      else {
        std::__cxx11::string::string((string *)&local_38,"_trieInsert failed.",&local_39);
        Limonp::Logger::LoggingF(3,"Trie.hpp",0x8f,&local_38);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"cann\'t find fiel[%s].",&local_39);
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x88,&local_38,filePath);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool loadDict(const char * const filePath)
            {
                if(!_getInitFlag())
                {
                    LogError("not initted.");
                    return false;
                }

                if(!checkFileExist(filePath))
                {
                    LogError("cann't find fiel[%s].",filePath);
                    return false;
                }
                bool res = false;
                res = _trieInsert(filePath);
                if(!res)
                {
                    LogError("_trieInsert failed.");
                    return false;
                }
                res = _countWeight();
                if(!res)
                {
                    LogError("_countWeight failed.");
                    return false;
                }
                return true;
            }